

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_aaa_x86_64(CPUX86State *env)

{
  ulong uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  uVar1 = env->regs[0];
  uVar3 = (uint)uVar1;
  uVar4 = (uint)(uVar1 >> 8) & 0xffffff;
  uVar5 = uVar3 & 0xf;
  if ((byte)((byte)((uVar2 & 0x10) >> 4) | 9 < uVar5) == 1) {
    uVar5 = uVar3 + 6 & 0xf;
    uVar4 = (uVar4 - ((uVar3 & 0xfe) < 0xfa)) + 2;
    uVar3 = uVar2 | 0x11;
  }
  else {
    uVar3 = uVar2 & 0xffffffee;
  }
  env->regs[0] = (ulong)((uVar4 & 0xff) << 8) | (ulong)uVar5 | uVar1 & 0xffffffffffff0000;
  env->cc_src = (long)(int)uVar3;
  return;
}

Assistant:

void helper_aaa(CPUX86State *env)
{
    int icarry;
    int al, ah, af;
    int eflags;

    eflags = cpu_cc_compute_all(env, CC_OP);
    af = eflags & CC_A;
    al = env->regs[R_EAX] & 0xff;
    ah = (env->regs[R_EAX] >> 8) & 0xff;

    icarry = (al > 0xf9);
    if (((al & 0x0f) > 9) || af) {
        al = (al + 6) & 0x0f;
        ah = (ah + 1 + icarry) & 0xff;
        eflags |= CC_C | CC_A;
    } else {
        eflags &= ~(CC_C | CC_A);
        al &= 0x0f;
    }
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | al | (ah << 8);
    CC_SRC = eflags;
}